

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateBuildingCode
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  JavaType JVar1;
  FieldDescriptor *field;
  char *pcVar2;
  size_t sVar3;
  string_view text;
  
  field = MapValueField(this->descriptor_);
  JVar1 = GetJavaType(field);
  if (JVar1 == JAVATYPE_MESSAGE) {
    pcVar2 = 
    "if ($get_has_field_bit_from_local$) {\n  result.$name$_ = internalGet$capitalized_name$().build($map_field_parameter$);\n}\n"
    ;
    sVar3 = 0x79;
  }
  else {
    pcVar2 = 
    "if ($get_has_field_bit_from_local$) {\n  result.$name$_ = internalGet$capitalized_name$();\n  result.$name$_.makeImmutable();\n}\n"
    ;
    sVar3 = 0x7e;
  }
  text._M_str = pcVar2;
  text._M_len = sVar3;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  if (GetJavaType(MapValueField(descriptor_)) == JAVATYPE_MESSAGE) {
    printer->Print(
        variables_,
        "if ($get_has_field_bit_from_local$) {\n"
        "  result.$name$_ = "
        "internalGet$capitalized_name$().build($map_field_parameter$);\n"
        "}\n");
    return;
  }
  printer->Print(variables_,
                 "if ($get_has_field_bit_from_local$) {\n"
                 "  result.$name$_ = internalGet$capitalized_name$();\n"
                 "  result.$name$_.makeImmutable();\n"
                 "}\n");
}